

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

int ImParseFormatPrecision(char *fmt,int default_precision)

{
  uint uVar1;
  long lVar2;
  char cVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  
  while( true ) {
    cVar3 = *fmt;
    if (cVar3 == '\0') {
      return default_precision;
    }
    if ((cVar3 == '%') && (fmt[1] != '%')) break;
    fmt = fmt + (ulong)(cVar3 == '%') + 1;
  }
  pcVar6 = fmt + 2;
  do {
    pcVar5 = pcVar6;
    cVar3 = pcVar5[-1];
    pcVar6 = pcVar5 + 1;
  } while ((byte)(cVar3 - 0x30U) < 10);
  uVar1 = 0x7fffffff;
  if (cVar3 == '.') {
    uVar4 = (ulong)(*pcVar5 == '-');
    lVar2 = (pcVar5[uVar4] == '+') + uVar4;
    cVar3 = pcVar5[lVar2];
    uVar7 = 0;
    if ((byte)(cVar3 - 0x30U) < 10) {
      pcVar6 = pcVar5 + 1 + lVar2;
      uVar7 = 0;
      do {
        uVar7 = (uint)(byte)(cVar3 - 0x30) + uVar7 * 10;
        cVar3 = *pcVar6;
        pcVar6 = pcVar6 + 1;
      } while ((byte)(cVar3 - 0x30U) < 10);
    }
    uVar1 = -uVar7;
    if (*pcVar5 != '-') {
      uVar1 = uVar7;
    }
    if (99 < uVar1) {
      uVar1 = default_precision;
    }
  }
  if ((cVar3 != 'E') && (cVar3 != 'e')) {
    if (cVar3 == 'g') {
      if (uVar1 != 0x7fffffff) {
        return uVar1;
      }
    }
    else if ((cVar3 != 'G') || (uVar1 != 0x7fffffff)) {
      if (uVar1 == 0x7fffffff) {
        uVar1 = default_precision;
      }
      return uVar1;
    }
  }
  return -1;
}

Assistant:

const char* ImParseFormatFindStart(const char* fmt)
{
    while (char c = fmt[0])
    {
        if (c == '%' && fmt[1] != '%')
            return fmt;
        else if (c == '%')
            fmt++;
        fmt++;
    }
    return fmt;
}